

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minheap-internal.h
# Opt level: O0

void min_heap_shift_down_(min_heap_t *s,uint hole_index,event *e)

{
  event *peVar1;
  int iVar2;
  bool local_25;
  uint local_24;
  uint min_child;
  event *e_local;
  uint hole_index_local;
  min_heap_t *s_local;
  
  iVar2 = hole_index + 1;
  e_local._4_4_ = hole_index;
  while (local_24 = iVar2 * 2, local_24 <= s->n) {
    local_25 = true;
    if (local_24 != s->n) {
      if ((s->p[local_24]->ev_timeout).tv_sec == (s->p[local_24 - 1]->ev_timeout).tv_sec) {
        local_25 = (s->p[local_24 - 1]->ev_timeout).tv_usec < (s->p[local_24]->ev_timeout).tv_usec;
      }
      else {
        local_25 = (s->p[local_24 - 1]->ev_timeout).tv_sec < (s->p[local_24]->ev_timeout).tv_sec;
      }
    }
    local_24 = local_24 - local_25;
    if ((e->ev_timeout).tv_sec == (s->p[local_24]->ev_timeout).tv_sec) {
      if ((e->ev_timeout).tv_usec <= (s->p[local_24]->ev_timeout).tv_usec) break;
    }
    else if ((e->ev_timeout).tv_sec <= (s->p[local_24]->ev_timeout).tv_sec) break;
    peVar1 = s->p[local_24];
    s->p[e_local._4_4_] = peVar1;
    (peVar1->ev_timeout_pos).min_heap_idx = e_local._4_4_;
    e_local._4_4_ = local_24;
    iVar2 = local_24 + 1;
  }
  s->p[e_local._4_4_] = e;
  (e->ev_timeout_pos).min_heap_idx = e_local._4_4_;
  return;
}

Assistant:

void min_heap_shift_down_(min_heap_t* s, unsigned hole_index, struct event* e)
{
    unsigned min_child = 2 * (hole_index + 1);
    while (min_child <= s->n)
	{
	min_child -= min_child == s->n || min_heap_elem_greater(s->p[min_child], s->p[min_child - 1]);
	if (!(min_heap_elem_greater(e, s->p[min_child])))
	    break;
	(s->p[hole_index] = s->p[min_child])->ev_timeout_pos.min_heap_idx = hole_index;
	hole_index = min_child;
	min_child = 2 * (hole_index + 1);
	}
    (s->p[hole_index] = e)->ev_timeout_pos.min_heap_idx = hole_index;
}